

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManPrintOccurs(FILE *pFile,If_DsdMan_t *p)

{
  int *piVar1;
  void **ppvVar2;
  bool bVar3;
  long lVar4;
  void *__s;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  char Buffer [100];
  int local_ac;
  char local_98 [104];
  
  lVar4 = (long)(p->vObjs).nSize;
  if (lVar4 < 3) {
    uVar7 = 0;
    dVar12 = 0.0;
  }
  else {
    iVar5 = 0;
    lVar9 = 2;
    uVar7 = 0;
    do {
      uVar8 = *(uint *)((long)(p->vObjs).pArray[lVar9] + 4) >> 9 & 0x3ffff;
      iVar5 = iVar5 + uVar8;
      if (uVar8 < uVar7) {
        uVar8 = uVar7;
      }
      uVar7 = uVar8;
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
    dVar12 = (double)iVar5;
  }
  uVar8 = uVar7;
  if (1 < uVar7) {
    uVar10 = 0;
    uVar8 = 0;
    uVar6 = uVar7 - 1;
    if (uVar6 != 0) {
      do {
        uVar8 = uVar10 + 1;
        bVar3 = 9 < uVar6;
        uVar6 = uVar6 / 10;
        uVar10 = uVar8;
      } while (bVar3);
    }
  }
  uVar10 = uVar8 * 10 + 10;
  uVar6 = 0x10;
  if (0xe < uVar8 * 10 + 9) {
    uVar6 = uVar10;
  }
  if (uVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar6 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar10 << 2);
  }
  lVar4 = (long)(p->vObjs).nSize;
  if (2 < lVar4) {
    ppvVar2 = (p->vObjs).pArray;
    lVar9 = 2;
    do {
      uVar8 = *(uint *)((long)ppvVar2[lVar9] + 4) >> 9 & 0x3ffff;
      if (9 < uVar8) {
        if (uVar8 < 100) {
          uVar8 = uVar8 / 10 + 10;
        }
        else if (uVar8 < 1000) {
          uVar8 = uVar8 / 100 + 0x14;
        }
        else if (uVar8 < 10000) {
          uVar8 = uVar8 / 1000 + 0x1e;
        }
        else if (uVar8 < 100000) {
          uVar8 = uVar8 / 10000 + 0x28;
        }
        else {
          uVar8 = uVar8 / 100000 + 0x32;
        }
      }
      if ((int)uVar10 <= (int)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (ulong)uVar8 * 4);
      *piVar1 = *piVar1 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  fwrite("The distribution of object occurrences:\n",0x28,1,(FILE *)pFile);
  if (0 < (int)uVar10) {
    uVar11 = 0;
    local_ac = 0;
    do {
      if (*(int *)((long)__s + uVar11 * 4) != 0) {
        if (uVar11 < 10) {
          fprintf((FILE *)pFile,"%15d : ",uVar11 & 0xffffffff);
        }
        else {
          iVar5 = (int)((uVar11 & 0xffffffff) / 10) * -10;
          dVar14 = (double)(int)((uVar11 & 0xffffffff) / 10);
          dVar13 = pow(10.0,dVar14);
          dVar14 = pow(10.0,dVar14);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar11 + iVar5) * (int)dVar13),
                  (ulong)(((int)uVar11 + iVar5 + 1) * (int)dVar14 - 1));
          fprintf((FILE *)pFile,"%15s : ",local_98);
        }
        fprintf((FILE *)pFile,"%12d   ",(ulong)*(uint *)((long)__s + uVar11 * 4));
        local_ac = local_ac + *(int *)((long)__s + uVar11 * 4);
        fprintf((FILE *)pFile,"(%6.2f %%)",((double)local_ac * 100.0) / (double)(p->vObjs).nSize);
        fputc(10,(FILE *)pFile);
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.\n",dVar12 / (double)(p->vObjs).nSize,
          (ulong)uVar7);
  return;
}

Assistant:

void If_DsdManPrintOccurs( FILE * pFile, If_DsdMan_t * p )
{
    char Buffer[100];
    If_DsdObj_t * pObj;
    Vec_Int_t * vOccurs;
    int nOccurs, nOccursMax, nOccursAll;
    int i, k, nSizeMax, Counter = 0;
    // determine the largest fanin and fanout
    nOccursMax = nOccursAll = 0;
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        nOccursAll += nOccurs;
        nOccursMax  = Abc_MaxInt( nOccursMax, nOccurs );
    }
    // allocate storage for fanin/fanout numbers
    nSizeMax = 10 * (Abc_Base10Log(nOccursMax) + 1);
    vOccurs  = Vec_IntStart( nSizeMax );
    // count the number of fanins and fanouts
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        if ( nOccurs < 10 )
            Vec_IntAddToEntry( vOccurs, nOccurs, 1 );
        else if ( nOccurs < 100 )
            Vec_IntAddToEntry( vOccurs, 10 + nOccurs/10, 1 );
        else if ( nOccurs < 1000 )
            Vec_IntAddToEntry( vOccurs, 20 + nOccurs/100, 1 );
        else if ( nOccurs < 10000 )
            Vec_IntAddToEntry( vOccurs, 30 + nOccurs/1000, 1 );
        else if ( nOccurs < 100000 )
            Vec_IntAddToEntry( vOccurs, 40 + nOccurs/10000, 1 );
        else if ( nOccurs < 1000000 )
            Vec_IntAddToEntry( vOccurs, 50 + nOccurs/100000, 1 );
        else if ( nOccurs < 10000000 )
            Vec_IntAddToEntry( vOccurs, 60 + nOccurs/1000000, 1 );
    }
    fprintf( pFile, "The distribution of object occurrences:\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( Vec_IntEntry(vOccurs, k) == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        fprintf( pFile, "%12d   ", Vec_IntEntry(vOccurs, k) );
        Counter += Vec_IntEntry(vOccurs, k);
        fprintf( pFile, "(%6.2f %%)", 100.0*Counter/Vec_PtrSize(&p->vObjs) );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vOccurs );
    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.\n", nOccursMax,  1.0*nOccursAll/Vec_PtrSize(&p->vObjs) );
}